

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O1

int __thiscall dit::anon_unknown_0::TrieParserTests::init(TrieParserTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"single_case",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test}";
  pTVar1[1].m_testCtx = (TestContext *)init::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 2;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "simple_group_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a{b}}";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "simple_group_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a{b,c}}";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"two_groups",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a{b},c{d,e}}";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"case_group",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a,c{d,e}}";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"group_case",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{c{d,e},a}";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_cr",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test}\r";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 2;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_lf",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test}\n";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 2;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"trailing_crlf"
             ,"");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test}\r\n";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::TrieParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 2;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_string",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x2389cd;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_line",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x2389cc;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_root",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_group",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test{}}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_group_name_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{{}}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_group_name_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{{test}}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_root_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x23f2d1;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_root_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_root_3","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test,";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_root_4","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test{a}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_root_5","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x222327;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_group_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test{";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_group_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test{a";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_group_3","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test{a,";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "unterminated_group_4","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{test{a,b";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_case_name_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a,,b}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_case_name_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{,b}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_case_name_3","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a,}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"no_separator",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a{b}c}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "invalid_char_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a.b}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "invalid_char_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a[]}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "trailing_char_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a}}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "trailing_char_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a}x";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "embedded_newline_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{\na}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "embedded_newline_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a\n,b}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "embedded_newline_3","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a,\nb}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "embedded_newline_4","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a{b\n}}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "embedded_newline_5","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"{a{b}\n}";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		{
			static const char* const	caseList	= "{test}";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "single_case", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a{b}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "simple_group_1", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a{b,c}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "simple_group_2", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a{b},c{d,e}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "two_groups", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{a,c{d,e}}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_CASE	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "case_group", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{c{d,e},a}";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_CASE	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "group_case", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{test}\r";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "trailing_cr", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{test}\n";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "trailing_lf", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "{test}\r\n";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "trailing_crlf", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}

		// Negative tests
		addChild(new NegativeCaseListCase(m_testCtx, "empty_string",			""));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_line",				"\n"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_root",				"{}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group",				"{test{}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group_name_1",		"{{}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group_name_2",		"{{test}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_1",		"{"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_2",		"{test"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_3",		"{test,"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_4",		"{test{a}"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_root_5",		"{a,b"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_1",	"{test{"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_2",	"{test{a"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_3",	"{test{a,"));
		addChild(new NegativeCaseListCase(m_testCtx, "unterminated_group_4",	"{test{a,b"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name_1",		"{a,,b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name_2",		"{,b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name_3",		"{a,}"));
		addChild(new NegativeCaseListCase(m_testCtx, "no_separator",			"{a{b}c}"));
		addChild(new NegativeCaseListCase(m_testCtx, "invalid_char_1",			"{a.b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "invalid_char_2",			"{a[]}"));
		addChild(new NegativeCaseListCase(m_testCtx, "trailing_char_1",			"{a}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "trailing_char_2",			"{a}x"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_1",		"{\na}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_2",		"{a\n,b}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_3",		"{a,\nb}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_4",		"{a{b\n}}"));
		addChild(new NegativeCaseListCase(m_testCtx, "embedded_newline_5",		"{a{b}\n}"));
	}